

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O2

bool __thiscall QDesktopUnixServices::openDocument(QDesktopUnixServices *this,QUrl *url)

{
  QUrl *this_00;
  char cVar1;
  bool bVar2;
  undefined4 uVar3;
  QWindow *this_01;
  QPlatformNativeInterface *pQVar4;
  long *plVar5;
  QPlatformWindow *pQVar6;
  void **ppvVar7;
  undefined4 *puVar8;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff6c;
  anon_class_16_2_6708b258_for_o local_78;
  anon_class_8_1_8991fb9c_for_openDocumentInternal local_68;
  Connection local_60 [8];
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.this = this;
  QGuiApplication::platformName();
  cVar1 = QString::startsWith((QLatin1String *)&local_58,7);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (cVar1 == '\0') {
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_58.size = 0;
    bVar2 = QtPrivate::detail::
            StorageByValue<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/platform/unix/qdesktopunixservices.cpp:541:35),_void>
            ::anon_class_16_2_6708b258_for_o::anon_class_8_1_8991fb9c_for_openDocumentInternal::
            operator()(&local_68,url,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    goto LAB_0057cd65;
  }
  this_00 = &local_78.url;
  local_78.openDocumentInternal.this = this;
  QUrl::QUrl(this_00,url);
  this_01 = QGuiApplication::focusWindow();
  if (this_01 == (QWindow *)0x0) {
LAB_0057cd35:
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_58.size = 0;
    QtPrivate::detail::
    StorageByValue<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/platform/unix/qdesktopunixservices.cpp:541:35),_void>
    ::anon_class_16_2_6708b258_for_o::operator()(&local_78,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  else {
    pQVar4 = QGuiApplication::platformNativeInterface();
    if (pQVar4 == (QPlatformNativeInterface *)0x0) {
      plVar5 = (long *)0x0;
    }
    else {
      plVar5 = (long *)__dynamic_cast(pQVar4,&QPlatformNativeInterface::typeinfo,
                                      &QNativeInterface::QWaylandApplication::typeinfo,
                                      0xfffffffffffffffe);
    }
    pQVar6 = QWindow::handle(this_01);
    if (pQVar6 == (QPlatformWindow *)0x0) goto LAB_0057cd35;
    ppvVar7 = (void **)__dynamic_cast(pQVar6,&QPlatformWindow::typeinfo,
                                      &QNativeInterface::Private::QWaylandWindow::typeinfo,
                                      0xfffffffffffffffe);
    if (ppvVar7 == (void **)0x0 || plVar5 == (long *)0x0) goto LAB_0057cd35;
    local_58.d = (Data *)QNativeInterface::Private::QWaylandWindow::xdgActivationTokenCreated;
    local_58.ptr = (char16_t *)0x0;
    puVar8 = (undefined4 *)operator_new(0x20);
    *puVar8 = 1;
    *(code **)(puVar8 + 2) =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/platform/unix/qdesktopunixservices.cpp:541:35),_QtPrivate::List<const_QString_&>,_void>
         ::impl;
    *(QDesktopUnixServices **)(puVar8 + 4) = local_78.openDocumentInternal.this;
    QUrl::QUrl((QUrl *)(puVar8 + 6),this_00);
    QObject::connectImpl
              ((QObject *)local_60,ppvVar7,(QObject *)&local_58,ppvVar7,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar8,(int *)CONCAT44(in_stack_ffffffffffffff6c,0x100),
               (QMetaObject *)0x0);
    QMetaObject::Connection::~Connection(local_60);
    uVar3 = (**(code **)(*plVar5 + 0x40))(plVar5);
    (**(code **)((long)*ppvVar7 + 0x70))(ppvVar7,uVar3);
  }
  QUrl::~QUrl(this_00);
  bVar2 = true;
LAB_0057cd65:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QDesktopUnixServices::openDocument(const QUrl &url)
{
    auto openDocumentInternal = [this](const QUrl &url, const QString &xdgActivationToken) {

#  if QT_CONFIG(dbus)
        if (checkNeedPortalSupport()) {
            const QString parentWindow = QGuiApplication::focusWindow()
                    ? portalWindowIdentifier(QGuiApplication::focusWindow())
                    : QString();
            QDBusError error = xdgDesktopPortalOpenFile(url, parentWindow, xdgActivationToken);
            if (!error.isValid())
                return true;
        }
#  endif

        if (m_documentLauncher.isEmpty()
            && !detectWebBrowser(desktopEnvironment(), false, &m_documentLauncher)) {
            qCWarning(lcQpaServices, "Unable to detect a launcher for '%s'", qPrintable(url.toString()));
            return false;
        }
        return launch(m_documentLauncher, url, xdgActivationToken);
    };

    if (QGuiApplication::platformName().startsWith("wayland"_L1)) {
        runWithXdgActivationToken([openDocumentInternal, url](const QString &token) {
            openDocumentInternal(url, token);
        });

        return true;
    } else {
        return openDocumentInternal(url, QString());
    }
}